

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav_ins.c
# Opt level: O2

void fsnav_ins_scheduler(void)

{
  fsnav_struct *pfVar1;
  char *pcVar2;
  double dVar3;
  char u_token [7];
  char yaw_token [9];
  char t0_token [10];
  char limit_token [11];
  char accs_token [11];
  char g_token [8];
  char e2_token [8];
  char madgwick_token [23];
  
  pfVar1 = fsnav;
  builtin_strncpy(u_token,"u_zero",7);
  builtin_strncpy(e2_token,"e2_zero",8);
  builtin_strncpy(g_token,"g_const",8);
  builtin_strncpy(accs_token,"accs_align",0xb);
  builtin_strncpy(yaw_token,"yaw_zero",9);
  builtin_strncpy(limit_token,"time_limit",0xb);
  builtin_strncpy(t0_token,"alignment",10);
  builtin_strncpy(madgwick_token,"madgwick_feedback_rate",0x17);
  if (fsnav->mode == 0) {
    puts("16-bit mode of IMU measurements");
    pcVar2 = fsnav_locate_token(u_token,fsnav->cfg_settings,fsnav->settings_length,'\0');
    if (pcVar2 != (char *)0x0) {
      (fsnav->imu_const).u = 0.0;
      puts("u_zero");
    }
    pcVar2 = fsnav_locate_token(e2_token,fsnav->cfg_settings,fsnav->settings_length,'\0');
    if (pcVar2 != (char *)0x0) {
      (fsnav->imu_const).e2 = 0.0;
      puts("e2_zero");
    }
    pcVar2 = fsnav_locate_token(g_token,fsnav->cfg_settings,fsnav->settings_length,'\0');
    if (pcVar2 == (char *)0x0) {
      (*fsnav->suspend_plugin)(fsnav_ins_gravity_constant);
    }
    else {
      (*fsnav->suspend_plugin)(fsnav_ins_gravity_normal);
      puts("g_const");
    }
    pcVar2 = fsnav_locate_token(madgwick_token,fsnav->imu->cfg,fsnav->imu->cfglength,'=');
    if (pcVar2 == (char *)0x0) {
      (*fsnav->suspend_plugin)(fsnav_ins_attitude_madgwick);
    }
    else {
      fsnav_ins_scheduler::madgwick_rate = atof(pcVar2);
      dVar3 = ABS(fsnav_ins_scheduler::madgwick_rate);
      if ((0x3fe < (uint)((long)dVar3 + 0xfff0000000000000U >> 0x35) ||
          -1 < (long)fsnav_ins_scheduler::madgwick_rate) &&
          ((dVar3 != INFINITY && (dVar3 != 0.0 && (ulong)dVar3 < 0x7ff0000000000000)) &&
          (0xffffffffffffe < (long)dVar3 - 1U || -1 < (long)fsnav_ins_scheduler::madgwick_rate))) {
        (*fsnav->suspend_plugin)(fsnav_ins_attitude_rodrigues);
        printf("%s = %g\n",fsnav_ins_scheduler::madgwick_rate,madgwick_token);
      }
      else {
        (*fsnav->suspend_plugin)(fsnav_ins_attitude_madgwick);
      }
    }
    pcVar2 = fsnav_locate_token(accs_token,fsnav->cfg_settings,fsnav->settings_length,'\0');
    if (pcVar2 == (char *)0x0) {
      (*fsnav->suspend_plugin)(fsnav_ins_alignment_static_accs);
    }
    else {
      (*fsnav->suspend_plugin)(fsnav_ins_alignment_static);
      puts("accs_align");
    }
    pcVar2 = fsnav_locate_token(yaw_token,fsnav->cfg_settings,fsnav->settings_length,'\0');
    if (pcVar2 == (char *)0x0) {
      fsnav_ins_scheduler_yaw_zero = 0;
      (*fsnav->suspend_plugin)(fsnav_ins_set_yaw_zero);
    }
    else {
      fsnav_ins_scheduler_yaw_zero = 1;
      puts("yaw_zero");
    }
    pcVar2 = fsnav_locate_token(limit_token,fsnav->cfg_settings,fsnav->settings_length,'=');
    if ((pcVar2 == (char *)0x0) ||
       (fsnav_ins_scheduler::time_limit = atof(pcVar2), fsnav_ins_scheduler::time_limit <= 0.0)) {
      fsnav_ins_scheduler::time_limit = 1.79769313486232e+308;
    }
    pcVar2 = fsnav_locate_token(t0_token,fsnav->imu->cfg,fsnav->imu->cfglength,'=');
    if ((pcVar2 != (char *)0x0) &&
       (fsnav_ins_scheduler::t0 = atof(pcVar2), 0.0 < fsnav_ins_scheduler::t0)) {
      return;
    }
    fsnav_ins_scheduler::t0 = 300.0;
    return;
  }
  if (fsnav->mode < 0) {
    return;
  }
  dVar3 = fsnav->imu->t;
  if (fsnav_ins_scheduler::time_limit < dVar3) {
    fsnav->mode = -1;
  }
  if (dVar3 <= fsnav_ins_scheduler::t0) {
    return;
  }
  if ((fsnav_ins_scheduler_yaw_zero & 1) == 0) {
    return;
  }
  (*pfVar1->suspend_plugin)(fsnav_ins_set_yaw_zero);
  fsnav_ins_scheduler_yaw_zero = 0;
  return;
}

Assistant:

void fsnav_ins_scheduler(void)
{
	const char
		u_token       [] = "u_zero",     // имя параметра в строке конфигурации для обнуления угловой скорости земли
		e2_token      [] = "e2_zero",    // имя параметра в строке конфигурации для обнуления эксцентриситета
		g_token       [] = "g_const",    // имя параметра в строке конфигурации, определяющего режим счисления силы тяжести
		accs_token    [] = "accs_align", // имя параметра в строке конфигурации для выставки по акселерометрам
		yaw_token     [] = "yaw_zero";   // имя параметра в строке конфигурации для обнуления угла курса на этапе выставки
		
	static char yaw_zero; // флаг обнуления угла курса на этапе выставки

	const char    limit_token[] = "time_limit"; // имя параметра в строке конфигурации для ограничения по времени
	const double  limit_default = DBL_MAX;      // стандартное ограничение по времени (без ограничения), сек
	static double time_limit    = -1;

	const char    t0_token[] = "alignment"; // имя параметра в строке конфигурации с временем выставки
	const double  t0_default = 300;         // стандартное время выставки, сек
	static double t0         = -1;

	const char    madgwick_token[] = "madgwick_feedback_rate"; // имя параметра в строке конфигурации для счисления ориентации фильтром Мэджвика
	static double madgwick_rate    = -1;                       // параметр настройки фильтра Маджвика, рад/сек 

	char *cfg_ptr; // указатель на параметр в строке конфигурации

	// инициализация
	if (fsnav->mode == 0) {

#ifdef BIT16
	printf("16-bit mode of IMU measurements\n");
#else
	printf("32-bit mode of IMU measurements\n");
#endif

		// модификация констант на шине
			// поиск флага обнуления угловой скорости в конфигурации
		cfg_ptr = fsnav_locate_token(u_token, fsnav->cfg_settings, fsnav->settings_length, 0);
		if (cfg_ptr != NULL) {
			fsnav->imu_const.u = 0;
			printf("u_zero\n");
		}
			// поиск флага обнуления эксцентриситета в конфигурации
		cfg_ptr = fsnav_locate_token(e2_token, fsnav->cfg_settings, fsnav->settings_length, 0);
		if (cfg_ptr != NULL) {
			fsnav->imu_const.e2 = 0;
			printf("e2_zero\n");
		}
		
		// отключение плагинов в списке выполнения
			// поиск флага постоянста силы тяжести
		cfg_ptr = fsnav_locate_token(g_token, fsnav->cfg_settings, fsnav->settings_length, 0);
		if (cfg_ptr != NULL) {
			fsnav->suspend_plugin(fsnav_ins_gravity_normal);
			printf("g_const\n");
		}
		else
			fsnav->suspend_plugin(fsnav_ins_gravity_constant);
			// поиск флага счисления ориентации фильтром Маджвика
		cfg_ptr = fsnav_locate_token(madgwick_token, fsnav->imu->cfg, fsnav->imu->cfglength, '=');
		if (cfg_ptr != NULL) {
			madgwick_rate = atof(cfg_ptr); 
			if (madgwick_rate > 0 && isfinite(madgwick_rate)) {
				fsnav->suspend_plugin(fsnav_ins_attitude_rodrigues);
				printf("%s = %g\n", madgwick_token, madgwick_rate);
			}
			else
				fsnav->suspend_plugin(fsnav_ins_attitude_madgwick);
		}
		else
			fsnav->suspend_plugin(fsnav_ins_attitude_madgwick);
			// поиск флага выставки по акселерометрам
		cfg_ptr = fsnav_locate_token(accs_token, fsnav->cfg_settings, fsnav->settings_length, 0);
		if (cfg_ptr != NULL) {
			fsnav->suspend_plugin(fsnav_ins_alignment_static);
			printf("accs_align\n");
		}
		else
			fsnav->suspend_plugin(fsnav_ins_alignment_static_accs);
			// поиск флага обнуления угла курса на этапе выставки
		cfg_ptr = fsnav_locate_token(yaw_token, fsnav->cfg_settings, fsnav->settings_length, 0);
		if (cfg_ptr != NULL) {
			yaw_zero = 1;
			printf("yaw_zero\n");
		}
		else {
			yaw_zero = 0;
			fsnav->suspend_plugin(fsnav_ins_set_yaw_zero);
		}

		// временные параметры
			// поиск ограничения по времени в конфигурации
		cfg_ptr = fsnav_locate_token(limit_token, fsnav->cfg_settings, fsnav->settings_length, '=');
		if (cfg_ptr != NULL)
			time_limit = atof(cfg_ptr);
		if (cfg_ptr == NULL || time_limit <= 0)
			time_limit = limit_default;
			// поиск времени выставки в конфигурации
		cfg_ptr = fsnav_locate_token(t0_token, fsnav->imu->cfg, fsnav->imu->cfglength, '=');
		if (cfg_ptr != NULL)
			t0 = atof(cfg_ptr);
		if (cfg_ptr == NULL || t0 <= 0)
			t0 = t0_default;
	}

	// завершение работы
	else if (fsnav->mode < 0) {}

	// шаг основного цикла
	else {
		if (fsnav->imu->t > time_limit)
			fsnav->mode = -1;

		if (fsnav->imu->t > t0 && yaw_zero) {
			fsnav->suspend_plugin(fsnav_ins_set_yaw_zero);
			yaw_zero = 0;
		}
	}
}